

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

EventSignalPtr * __thiscall entityx::EventManager::signal_for(EventManager *this,size_t id)

{
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *this_00;
  long lVar1;
  long lVar2;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  this_00 = (vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
             *)(this + 8);
  lVar1 = *(long *)(this + 8);
  if ((ulong)(*(long *)(this + 0x10) - lVar1 >> 4) <= id) {
    Catch::clara::std::
    vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
    ::resize(this_00,id + 1);
    lVar1 = *(long *)this_00;
  }
  lVar2 = id * 0x10;
  if (*(long *)(lVar1 + lVar2) == 0) {
    std::make_shared<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>();
    Catch::clara::std::
    __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)(*(long *)this_00 + lVar2),&_Stack_28);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&_Stack_28._M_refcount);
    lVar1 = *(long *)this_00;
  }
  return (EventSignalPtr *)(lVar1 + lVar2);
}

Assistant:

EventSignalPtr &signal_for(std::size_t id) {
    if (id >= handlers_.size())
      handlers_.resize(id + 1);
    if (!handlers_[id])
      handlers_[id] = std::make_shared<EventSignal>();
    return handlers_[id];
  }